

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcacheoptimizer.cpp
# Opt level: O1

void meshopt_optimizeVertexCacheFifo
               (uint *destination,uint *indices,size_t index_count,size_t vertex_count,
               uint cache_size)

{
  size_t __n;
  int *piVar1;
  void **ppvVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint *puVar10;
  int iVar11;
  uint *indices_00;
  void *__dest;
  void *__s;
  void *pvVar12;
  void *__s_00;
  long lVar13;
  ulong uVar14;
  int iVar15;
  size_t sVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  ulong uVar24;
  TriangleAdjacency adjacency;
  meshopt_Allocator allocator;
  TriangleAdjacency local_118;
  meshopt_Allocator local_f8;
  
  memset(&local_f8,0,200);
  sVar16 = local_f8.count;
  if (vertex_count != 0 && index_count != 0) {
    indices_00 = indices;
    if (destination == indices) {
      sVar16 = 0xffffffffffffffff;
      if (index_count < 0x4000000000000000) {
        sVar16 = index_count * 4;
      }
      indices_00 = (uint *)(*meshopt_Allocator::StorageT<void>::allocate)(sVar16);
      ppvVar2 = local_f8.blocks + local_f8.count;
      local_f8.count = local_f8.count + 1;
      *ppvVar2 = indices_00;
      memcpy(indices_00,indices,index_count * 4);
    }
    local_118.counts = (uint *)0x0;
    local_118.offsets = (uint *)0x0;
    local_118.data = (uint *)0x0;
    meshopt::buildTriangleAdjacency(&local_118,indices_00,index_count,vertex_count,&local_f8);
    __n = vertex_count * 4;
    sVar16 = 0xffffffffffffffff;
    if (vertex_count < 0x4000000000000000) {
      sVar16 = __n;
    }
    __dest = (*meshopt_Allocator::StorageT<void>::allocate)(sVar16);
    puVar10 = local_118.counts;
    ppvVar2 = local_f8.blocks + local_f8.count;
    local_f8.count = local_f8.count + 1;
    *ppvVar2 = __dest;
    memcpy(__dest,local_118.counts,__n);
    __s = (*meshopt_Allocator::StorageT<void>::allocate)(sVar16);
    ppvVar2 = local_f8.blocks + local_f8.count;
    local_f8.count = local_f8.count + 1;
    *ppvVar2 = __s;
    memset(__s,0,__n);
    sVar16 = 0xffffffffffffffff;
    if (index_count < 0x4000000000000000) {
      sVar16 = index_count * 4;
    }
    pvVar12 = (*meshopt_Allocator::StorageT<void>::allocate)(sVar16);
    ppvVar2 = local_f8.blocks + local_f8.count;
    local_f8.count = local_f8.count + 1;
    *ppvVar2 = pvVar12;
    __s_00 = (*meshopt_Allocator::StorageT<void>::allocate)(index_count / 3);
    ppvVar2 = local_f8.blocks + local_f8.count;
    local_f8.count = local_f8.count + 1;
    *ppvVar2 = __s_00;
    memset(__s_00,0,index_count / 3);
    iVar11 = cache_size + 1;
    uVar14 = 1;
    uVar22 = 0;
    iVar23 = 0;
    uVar19 = 0;
    do {
      uVar3 = puVar10[uVar22];
      if ((ulong)uVar3 == 0) {
        uVar20 = (ulong)uVar19;
      }
      else {
        uVar4 = local_118.offsets[uVar22];
        lVar13 = 0;
        uVar20 = (ulong)uVar19;
        do {
          uVar5 = *(uint *)((long)local_118.data + lVar13 + (ulong)uVar4 * 4);
          uVar22 = (ulong)uVar5;
          if (*(char *)((long)__s_00 + uVar22) == '\0') {
            uVar5 = indices_00[uVar5 * 3];
            uVar17 = (ulong)uVar5;
            uVar6 = indices_00[uVar22 * 3 + 1 & 0xffffffff];
            uVar24 = (ulong)uVar6;
            uVar7 = indices_00[uVar22 * 3 + 2 & 0xffffffff];
            uVar21 = (ulong)uVar7;
            destination[(uint)(iVar23 * 3)] = uVar5;
            destination[iVar23 * 3 + 1] = uVar6;
            destination[iVar23 * 3 + 2] = uVar7;
            iVar18 = (int)uVar20;
            *(uint *)((long)pvVar12 + uVar20 * 4) = uVar5;
            *(uint *)((long)pvVar12 + (ulong)(iVar18 + 1) * 4) = uVar6;
            *(uint *)((long)pvVar12 + (ulong)(iVar18 + 2) * 4) = uVar7;
            piVar1 = (int *)((long)__dest + uVar17 * 4);
            *piVar1 = *piVar1 + -1;
            piVar1 = (int *)((long)__dest + uVar24 * 4);
            *piVar1 = *piVar1 + -1;
            piVar1 = (int *)((long)__dest + uVar21 * 4);
            *piVar1 = *piVar1 + -1;
            if (cache_size < (uint)(iVar11 - *(int *)((long)__s + uVar17 * 4))) {
              *(int *)((long)__s + uVar17 * 4) = iVar11;
              iVar11 = iVar11 + 1;
            }
            if (cache_size < (uint)(iVar11 - *(int *)((long)__s + uVar24 * 4))) {
              *(int *)((long)__s + uVar24 * 4) = iVar11;
              iVar11 = iVar11 + 1;
            }
            if (cache_size < (uint)(iVar11 - *(int *)((long)__s + uVar21 * 4))) {
              *(int *)((long)__s + uVar21 * 4) = iVar11;
              iVar11 = iVar11 + 1;
            }
            iVar23 = iVar23 + 1;
            uVar20 = (ulong)(iVar18 + 3);
            *(undefined1 *)((long)__s_00 + uVar22) = 1;
          }
          lVar13 = lVar13 + 4;
        } while ((ulong)uVar3 << 2 != lVar13);
      }
      uVar22 = 0xffffffff;
      if (uVar19 != (uint)uVar20) {
        lVar13 = (ulong)uVar19 << 2;
        uVar22 = 0xffffffff;
        iVar18 = -1;
        do {
          uVar19 = *(uint *)((long)pvVar12 + lVar13);
          iVar8 = *(int *)((long)__dest + (ulong)uVar19 * 4);
          if (iVar8 != 0) {
            iVar9 = *(int *)((long)__s + (ulong)uVar19 * 4);
            iVar15 = iVar11 - iVar9;
            if (cache_size < (uint)((iVar11 + iVar8 * 2) - iVar9)) {
              iVar15 = 0;
            }
            if (iVar18 < iVar15) {
              uVar22 = (ulong)uVar19;
              iVar18 = iVar15;
            }
          }
          lVar13 = lVar13 + 4;
        } while (uVar20 * 4 - lVar13 != 0);
      }
      if ((int)uVar22 == -1) {
        if ((uint)uVar20 != 0) {
          do {
            uVar20 = uVar20 - 1;
            uVar22 = (ulong)*(uint *)((long)pvVar12 + (uVar20 & 0xffffffff) * 4);
            if (*(int *)((long)__dest + uVar22 * 4) != 0) goto LAB_0017a721;
          } while (uVar20 != 0);
          uVar20 = 0;
        }
        for (; (uVar22 = 0xffffffff, uVar14 < vertex_count &&
               (uVar22 = uVar14, *(int *)((long)__dest + uVar14 * 4) == 0));
            uVar14 = (ulong)((int)uVar14 + 1)) {
        }
      }
LAB_0017a721:
      uVar19 = (uint)uVar20;
      sVar16 = local_f8.count;
    } while ((int)uVar22 != -1);
  }
  while (sVar16 != 0) {
    (*meshopt_Allocator::StorageT<void>::deallocate)(local_f8.blocks[sVar16 - 1]);
    sVar16 = sVar16 - 1;
  }
  return;
}

Assistant:

void meshopt_optimizeVertexCacheFifo(unsigned int* destination, const unsigned int* indices, size_t index_count, size_t vertex_count, unsigned int cache_size)
{
	using namespace meshopt;

	assert(index_count % 3 == 0);
	assert(cache_size >= 3);

	meshopt_Allocator allocator;

	// guard for empty meshes
	if (index_count == 0 || vertex_count == 0)
		return;

	// support in-place optimization
	if (destination == indices)
	{
		unsigned int* indices_copy = allocator.allocate<unsigned int>(index_count);
		memcpy(indices_copy, indices, index_count * sizeof(unsigned int));
		indices = indices_copy;
	}

	size_t face_count = index_count / 3;

	// build adjacency information
	TriangleAdjacency adjacency = {};
	buildTriangleAdjacency(adjacency, indices, index_count, vertex_count, allocator);

	// live triangle counts
	unsigned int* live_triangles = allocator.allocate<unsigned int>(vertex_count);
	memcpy(live_triangles, adjacency.counts, vertex_count * sizeof(unsigned int));

	// cache time stamps
	unsigned int* cache_timestamps = allocator.allocate<unsigned int>(vertex_count);
	memset(cache_timestamps, 0, vertex_count * sizeof(unsigned int));

	// dead-end stack
	unsigned int* dead_end = allocator.allocate<unsigned int>(index_count);
	unsigned int dead_end_top = 0;

	// emitted flags
	unsigned char* emitted_flags = allocator.allocate<unsigned char>(face_count);
	memset(emitted_flags, 0, face_count);

	unsigned int current_vertex = 0;

	unsigned int timestamp = cache_size + 1;
	unsigned int input_cursor = 1; // vertex to restart from in case of dead-end

	unsigned int output_triangle = 0;

	while (current_vertex != ~0u)
	{
		const unsigned int* next_candidates_begin = &dead_end[0] + dead_end_top;

		// emit all vertex neighbours
		const unsigned int* neighbours_begin = &adjacency.data[0] + adjacency.offsets[current_vertex];
		const unsigned int* neighbours_end = neighbours_begin + adjacency.counts[current_vertex];

		for (const unsigned int* it = neighbours_begin; it != neighbours_end; ++it)
		{
			unsigned int triangle = *it;

			if (!emitted_flags[triangle])
			{
				unsigned int a = indices[triangle * 3 + 0], b = indices[triangle * 3 + 1], c = indices[triangle * 3 + 2];

				// output indices
				destination[output_triangle * 3 + 0] = a;
				destination[output_triangle * 3 + 1] = b;
				destination[output_triangle * 3 + 2] = c;
				output_triangle++;

				// update dead-end stack
				dead_end[dead_end_top + 0] = a;
				dead_end[dead_end_top + 1] = b;
				dead_end[dead_end_top + 2] = c;
				dead_end_top += 3;

				// update live triangle counts
				live_triangles[a]--;
				live_triangles[b]--;
				live_triangles[c]--;

				// update cache info
				// if vertex is not in cache, put it in cache
				if (timestamp - cache_timestamps[a] > cache_size)
					cache_timestamps[a] = timestamp++;

				if (timestamp - cache_timestamps[b] > cache_size)
					cache_timestamps[b] = timestamp++;

				if (timestamp - cache_timestamps[c] > cache_size)
					cache_timestamps[c] = timestamp++;

				// update emitted flags
				emitted_flags[triangle] = true;
			}
		}

		// next candidates are the ones we pushed to dead-end stack just now
		const unsigned int* next_candidates_end = &dead_end[0] + dead_end_top;

		// get next vertex
		current_vertex = getNextVertexNeighbour(next_candidates_begin, next_candidates_end, &live_triangles[0], &cache_timestamps[0], timestamp, cache_size);

		if (current_vertex == ~0u)
		{
			current_vertex = getNextVertexDeadEnd(&dead_end[0], dead_end_top, input_cursor, &live_triangles[0], vertex_count);
		}
	}

	assert(output_triangle == face_count);
}